

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_long>&>
               (char *file,char line [7],LogSeverity severity,char *macroArgs,char (*params) [60],
               DebugComparison<unsigned_int,_unsigned_long>_conflict *params_1)

{
  undefined4 in_register_00000014;
  DebugComparison<unsigned_int,_unsigned_long> *params_00;
  long lVar1;
  char argValues [2] [7];
  String local_40;
  
  str<char_const(&)[60]>
            ((String *)argValues,(kj *)params,(char (*) [60])CONCAT44(in_register_00000014,severity)
            );
  str<kj::_::DebugComparison<unsigned_int,unsigned_long>&>(&local_40,(kj *)params_1,params_00);
  logInternal((Debug *)file,(char *)(ulong)line._0_4_,severity,(LogSeverity)macroArgs,argValues[0],
              _argValues);
  lVar1 = 0x18;
  do {
    Array<char>::~Array((Array<char> *)(argValues[0] + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}